

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float min_value;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4f45,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (value_getter == (_func_float_void_ptr_int *)0x0) {
    __assert_fail("value_getter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4f46,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (count == 0) {
    return;
  }
  fVar2 = (*value_getter)(userdata,offset);
  if (count < 1) {
    nk_chart_begin_colored
              (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,fVar2,fVar2
              );
  }
  else {
    iVar1 = 0;
    fVar3 = fVar2;
    do {
      min_value = (*value_getter)(userdata,offset + iVar1);
      if (fVar2 <= min_value) {
        fVar2 = min_value;
      }
      if (fVar3 <= min_value) {
        min_value = fVar3;
      }
      iVar1 = iVar1 + 1;
      fVar3 = min_value;
    } while (count != iVar1);
    nk_chart_begin_colored
              (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,min_value,
               fVar2);
    if (0 < count) {
      do {
        fVar2 = (*value_getter)(userdata,offset);
        nk_chart_push_slot(ctx,fVar2,0);
        offset = offset + 1;
        count = count + -1;
      } while (count != 0);
    }
  }
  nk_chart_end(ctx);
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
    float(*value_getter)(void* user, int index), int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(value_getter);
    if (!ctx || !value_getter || !count) return;

    max_value = min_value = value_getter(userdata, offset);
    for (i = 0; i < count; ++i) {
        float value = value_getter(userdata, i + offset);
        min_value = NK_MIN(value, min_value);
        max_value = NK_MAX(value, max_value);
    }
    nk_chart_begin(ctx, type, count, min_value, max_value);
    for (i = 0; i < count; ++i)
        nk_chart_push(ctx, value_getter(userdata, i + offset));
    nk_chart_end(ctx);
}